

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

Generator<std::tuple<std::vector<int,_std::allocator<int>_>_>_>
cppqc::tupleOf<std::vector<int,std::allocator<int>>>
          (Generator<std::vector<int,_std::allocator<int>_>_> *g)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
  in_RDI;
  Generator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffb8;
  TupleGenerator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffd8;
  Generator<std::tuple<std::vector<int,_std::allocator<int>_>_>_> *in_stack_ffffffffffffffe0;
  
  detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>::TupleGenerator
            ((TupleGenerator<std::vector<int,_std::allocator<int>_>_> *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
             ._M_head_impl,in_stack_ffffffffffffffb8);
  Generator<std::tuple<std::vector<int,std::allocator<int>>>>::
  Generator<cppqc::detail::TupleGenerator<std::vector<int,std::allocator<int>>>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  detail::TupleGenerator<std::vector<int,_std::allocator<int>_>_>::~TupleGenerator
            ((TupleGenerator<std::vector<int,_std::allocator<int>_>_> *)0x1230aa);
  return (unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
          )(unique_ptr<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
            )in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::GenConcept<std::tuple<std::vector<int,_std::allocator<int>_>_>_>_*,_false>
             ._M_head_impl;
}

Assistant:

Generator<std::tuple<T...>> tupleOf(const Generator<T>&... g) {
  return detail::TupleGenerator<T...>(g...);
}